

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

int __thiscall QMainWindowLayoutState::remove(QMainWindowLayoutState *this,char *__filename)

{
  QWidget *dockWidget;
  long in_FS_OFFSET;
  QList<int> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QToolBarAreaLayout::remove(&this->toolBarAreaLayout,__filename);
  (**(code **)(*(long *)__filename + 0x68))(__filename);
  dockWidget = (QWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
  if (dockWidget != (QWidget *)0x0) {
    local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    QDockAreaLayout::indexOf(&local_38,&this->dockAreaLayout,dockWidget);
    if ((undefined1 *)local_38.d.size != (undefined1 *)0x0) {
      QDockAreaLayout::remove(&this->dockAreaLayout,(char *)&local_38);
    }
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,4,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayoutState::remove(QLayoutItem *item)
{
#if QT_CONFIG(toolbar)
    toolBarAreaLayout.remove(item);
#endif

#if QT_CONFIG(dockwidget)
    // is it a dock widget?
    if (QDockWidget *dockWidget = qobject_cast<QDockWidget *>(item->widget())) {
        QList<int> path = dockAreaLayout.indexOf(dockWidget);
        if (!path.isEmpty())
            dockAreaLayout.remove(path);
    }
#endif // QT_CONFIG(dockwidget)
}